

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

fdb_status fdb_get_kvs_ops_info(fdb_kvs_handle *handle,fdb_kvs_ops_info *info)

{
  fdb_kvs_handle *pfVar1;
  filemgr *file;
  fdb_status fVar2;
  fdb_kvs_id_t kv_id;
  kvs_ops_stat stat;
  kvs_ops_stat root_stat;
  kvs_ops_stat local_90;
  kvs_ops_stat local_58;
  
  if (handle != (fdb_kvs_handle *)0x0) {
    if (info == (fdb_kvs_ops_info *)0x0) {
      fVar2 = FDB_RESULT_INVALID_ARGS;
    }
    else {
      pfVar1 = handle->fhandle->root;
      if (handle->shandle == (snap_handle *)0x0) {
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
        fdb_sync_db_header(handle);
      }
      file = handle->file;
      if (handle->kvs == (kvs_info *)0x0) {
        kv_id = 0;
      }
      else {
        kv_id = handle->kvs->id;
      }
      _kvs_ops_stat_get(file,kv_id,&local_90);
      if (pfVar1 == handle) {
        local_58.num_commits.super___atomic_base<unsigned_long>._M_i =
             local_90.num_commits.super___atomic_base<unsigned_long>._M_i;
        local_58.num_compacts.super___atomic_base<unsigned_long>._M_i =
             local_90.num_compacts.super___atomic_base<unsigned_long>._M_i;
      }
      else {
        _kvs_ops_stat_get(file,0,&local_58);
      }
      info->num_sets = (uint64_t)local_90.num_sets.super___atomic_base<unsigned_long>._M_i;
      info->num_dels = (uint64_t)local_90.num_dels.super___atomic_base<unsigned_long>._M_i;
      info->num_gets = (uint64_t)local_90.num_gets.super___atomic_base<unsigned_long>._M_i;
      info->num_iterator_gets =
           (uint64_t)local_90.num_iterator_gets.super___atomic_base<unsigned_long>._M_i;
      info->num_iterator_gets =
           (uint64_t)local_90.num_iterator_gets.super___atomic_base<unsigned_long>._M_i;
      info->num_iterator_moves =
           (uint64_t)local_90.num_iterator_moves.super___atomic_base<unsigned_long>._M_i;
      info->num_commits = (uint64_t)local_58.num_commits.super___atomic_base<unsigned_long>._M_i;
      info->num_compacts = (uint64_t)local_58.num_compacts.super___atomic_base<unsigned_long>._M_i;
      fVar2 = FDB_RESULT_SUCCESS;
    }
    return fVar2;
  }
  return FDB_RESULT_INVALID_HANDLE;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kvs_ops_info(fdb_kvs_handle *handle, fdb_kvs_ops_info *info)
{
    fdb_kvs_id_t kv_id;
    struct filemgr *file;
    struct kvs_ops_stat stat;
    struct kvs_ops_stat root_stat;

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!info) {
        return FDB_RESULT_INVALID_ARGS;
    }

    fdb_kvs_handle *root_handle = handle->fhandle->root;

    // for snapshot handle do not reopen new file as user is interested in
    // reader stats from the old file
    if (!handle->shandle) {
        // always get stats from the latest file
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    file = handle->file;

    if (handle->kvs == NULL) {
        kv_id = 0;
    } else {
        kv_id = handle->kvs->id;
    }

    _kvs_ops_stat_get(file, kv_id, &stat);

    if (root_handle != handle) {
        _kvs_ops_stat_get(file, 0, &root_stat);
    } else {
        root_stat = stat;
    }

    info->num_sets = atomic_get_uint64_t(&stat.num_sets, std::memory_order_relaxed);
    info->num_dels = atomic_get_uint64_t(&stat.num_dels, std::memory_order_relaxed);
    info->num_gets = atomic_get_uint64_t(&stat.num_gets, std::memory_order_relaxed);
    info->num_iterator_gets = atomic_get_uint64_t(&stat.num_iterator_gets,
                                                  std::memory_order_relaxed);
    info->num_iterator_gets = atomic_get_uint64_t(&stat.num_iterator_gets,
                                                  std::memory_order_relaxed);
    info->num_iterator_moves = atomic_get_uint64_t(&stat.num_iterator_moves,
                                                   std::memory_order_relaxed);

    info->num_commits = atomic_get_uint64_t(&root_stat.num_commits,
                                            std::memory_order_relaxed);
    info->num_compacts = atomic_get_uint64_t(&root_stat.num_compacts,
                                             std::memory_order_relaxed);
    return FDB_RESULT_SUCCESS;
}